

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

ModportDeclarationSyntax * __thiscall
slang::parsing::Parser::parseModportDeclaration(Parser *this,AttrList attributes)

{
  bool bVar1;
  int iVar2;
  SourceLocation location;
  ModportItemSyntax *pMVar3;
  undefined4 extraout_var;
  ModportDeclarationSyntax *pMVar4;
  Info *extraout_RDX;
  Info *src;
  ulong uVar5;
  TokenKind kind;
  Token keyword;
  Token TVar6;
  Token TVar7;
  Token TVar8;
  Token semi;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token local_1a8;
  Info *local_198;
  undefined8 local_190;
  pointer local_188;
  size_t local_180;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_178;
  ulong local_168;
  undefined8 uStack_160;
  size_t local_158;
  pointer local_150;
  size_t local_148;
  Token local_140;
  SyntaxNode *local_130;
  SyntaxNode *pSStack_128;
  pointer local_118;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_108 [4];
  
  local_180 = (size_t)attributes._M_extent._M_extent_value;
  local_188 = attributes._M_ptr;
  TVar6 = ParserBase::consume(&this->super_ParserBase);
  local_198 = TVar6.info;
  local_190 = TVar6._0_8_;
  Token::Token(&local_1a8);
  local_108[0].data_ = (pointer)local_108[0].firstElement;
  local_108[0].len = 0;
  local_108[0].cap = 8;
  TVar6 = ParserBase::peek(&this->super_ParserBase);
  local_140 = TVar6;
  bVar1 = syntax::SyntaxFacts::isSemicolon(TVar6.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      location = Token::location(&local_140);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x410005,location);
    }
  }
  else {
    bVar1 = syntax::SyntaxFacts::isIdentifierOrComma(TVar6.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar6,Semicolon,&local_1a8,(DiagCode)0x410005);
      src = extraout_RDX;
      goto LAB_001d7ee5;
    }
    local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseModportItem(this);
    local_168 = CONCAT71(local_168._1_7_,1);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (local_108,(TokenOrSyntax *)&local_178._M_first);
    TVar7 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = syntax::SyntaxFacts::isSemicolon(TVar7.kind);
    if (TVar7.kind == Comma && !bVar1) {
      do {
        local_178._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_168 = local_168 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_108,(TokenOrSyntax *)&local_178._M_first);
        TVar7 = ParserBase::peek(&this->super_ParserBase);
        kind = TVar7.kind;
        bVar1 = syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if ((TVar6.info == TVar7.info && TVar6.kind == kind) &&
           (bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                              (&this->super_ParserBase,(DiagCode)0x410005,true), !bVar1)) break;
        pMVar3 = parseModportItem(this);
        local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pMVar3;
        local_168 = CONCAT71(local_168._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_108,(TokenOrSyntax *)&local_178._M_first);
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = syntax::SyntaxFacts::isSemicolon(TVar8.kind);
        uVar5 = TVar7._0_8_ & 0xffffffff;
        TVar6.info = TVar7.info;
        TVar6.kind = (short)uVar5;
        TVar6._2_1_ = (char)(uVar5 >> 0x10);
        TVar6.numFlags.raw = (char)(uVar5 >> 0x18);
        TVar6.rawLen = (int)(uVar5 >> 0x20);
      } while (TVar8.kind == Comma && !bVar1);
    }
  }
  local_1a8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  src = local_1a8.info;
LAB_001d7ee5:
  local_178._8_4_ = 1;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = local_180;
  local_150 = local_188;
  local_148 = local_180;
  local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_002f75e8;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_108,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_118 = (pointer)CONCAT44(extraout_var,iVar2);
  local_140.info._0_4_ = 3;
  local_130 = (SyntaxNode *)0x0;
  pSStack_128 = (SyntaxNode *)0x0;
  local_140._0_8_ = &PTR_getChild_002f8528;
  keyword.info = local_198;
  keyword.kind = (undefined2)local_190;
  keyword._2_1_ = local_190._2_1_;
  keyword.numFlags.raw = local_190._3_1_;
  keyword.rawLen = local_190._4_4_;
  pMVar4 = syntax::SyntaxFactory::modportDeclaration
                     (&this->factory,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_178._M_first,
                      keyword,(SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *)&local_140,
                      local_1a8);
  if (local_108[0].data_ != (pointer)local_108[0].firstElement) {
    operator_delete(local_108[0].data_);
  }
  return pMVar4;
}

Assistant:

ModportDeclarationSyntax& Parser::parseModportDeclaration(AttrList attributes) {
    auto keyword = consume();

    Token semi;
    SmallVector<TokenOrSyntax, 8> buffer;
    parseList<isIdentifierOrComma, isSemicolon>(buffer, TokenKind::Semicolon, TokenKind::Comma,
                                                semi, RequireItems::True, diag::ExpectedIdentifier,
                                                [this] { return &parseModportItem(); });

    return factory.modportDeclaration(attributes, keyword, buffer.copy(alloc), semi);
}